

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O3

void __thiscall
TPZCompElH1<pzshape::TPZShapePiram>::SetConnectIndex
          (TPZCompElH1<pzshape::TPZShapePiram> *this,int i,int64_t connectindex)

{
  ostream *poVar1;
  
  if (0x12 < (uint)i) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," TPZIntelGen<TSHAPE>::SetConnectIndex index ",0x2c);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,i);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," out of range\n",0xe);
    return;
  }
  (this->fConnectIndexes).super_TPZVec<long>.fStore[(uint)i] = connectindex;
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::SetConnectIndex(int i, int64_t connectindex){
#ifndef PZNODEBUG
	if(i<0 || i>= TSHAPE::NSides) {
		std::cout << " TPZIntelGen<TSHAPE>::SetConnectIndex index " << i <<
		" out of range\n";
		return;
	}
#endif
	fConnectIndexes[i] = connectindex;
}